

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::RunContext::handleFatalErrorCondition(RunContext *this,string *message)

{
  size_t *psVar1;
  TestCase *_name;
  IStreamingReporter *pIVar2;
  allocator local_6ea;
  allocator local_6e9;
  string local_6e8;
  string local_6c8;
  Totals deltaTotals;
  Counts assertions;
  SectionInfo testCaseSection;
  TestCaseStats local_5f0;
  SectionStats testCaseSectionStats;
  TestCaseInfo testInfo;
  ResultBuilder resultBuilder;
  
  makeUnexpectedResultBuilder(&resultBuilder,this);
  resultBuilder.m_data.resultType = FatalErrorCondition;
  std::operator<<((ostream *)&resultBuilder.m_stream,(string *)message);
  ResultBuilder::captureExpression(&resultBuilder);
  handleUnfinishedSections(this);
  _name = this->m_activeTestCase;
  SectionInfo::SectionInfo
            (&testCaseSection,&(_name->super_TestCaseInfo).lineInfo,(string *)_name,
             &(_name->super_TestCaseInfo).description);
  assertions.passed = 0;
  assertions.failedButOk = 0;
  assertions.failed = 1;
  SectionStats::SectionStats(&testCaseSectionStats,&testCaseSection,&assertions,0.0,false);
  pIVar2 = (this->m_reporter).m_p;
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])(pIVar2,&testCaseSectionStats);
  TestCaseInfo::TestCaseInfo(&testInfo,&this->m_activeTestCase->super_TestCaseInfo);
  deltaTotals.testCases.failedButOk = 0;
  deltaTotals.assertions.failedButOk = 0;
  deltaTotals.testCases.passed = 0;
  deltaTotals.assertions.passed = 0;
  deltaTotals.assertions.failed = 0;
  deltaTotals.testCases.failed = 1;
  pIVar2 = (this->m_reporter).m_p;
  std::__cxx11::string::string((string *)&local_6e8,"",&local_6e9);
  std::__cxx11::string::string((string *)&local_6c8,"",&local_6ea);
  TestCaseStats::TestCaseStats(&local_5f0,&testInfo,&deltaTotals,&local_6e8,&local_6c8,false);
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xd])(pIVar2,&local_5f0);
  TestCaseStats::~TestCaseStats(&local_5f0);
  std::__cxx11::string::~string((string *)&local_6c8);
  std::__cxx11::string::~string((string *)&local_6e8);
  psVar1 = &(this->m_totals).testCases.failed;
  *psVar1 = *psVar1 + 1;
  std::__cxx11::string::string((string *)&local_5f0,"",(allocator *)&local_6e8);
  testGroupEnded(this,(string *)&local_5f0,&this->m_totals,1,1);
  std::__cxx11::string::~string((string *)&local_5f0);
  pIVar2 = (this->m_reporter).m_p;
  TestRunStats::TestRunStats((TestRunStats *)&local_5f0,&this->m_runInfo,&this->m_totals,false);
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xf])(pIVar2,&local_5f0);
  TestRunStats::~TestRunStats((TestRunStats *)&local_5f0);
  TestCaseInfo::~TestCaseInfo(&testInfo);
  SectionStats::~SectionStats(&testCaseSectionStats);
  SectionInfo::~SectionInfo(&testCaseSection);
  ResultBuilder::~ResultBuilder(&resultBuilder);
  return;
}

Assistant:

virtual void handleFatalErrorCondition( std::string const& message ) {
            ResultBuilder resultBuilder = makeUnexpectedResultBuilder();
            resultBuilder.setResultType( ResultWas::FatalErrorCondition );
            resultBuilder << message;
            resultBuilder.captureExpression();

            handleUnfinishedSections();

            // Recreate section for test case (as we will lose the one that was in scope)
            TestCaseInfo const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
            SectionInfo testCaseSection( testCaseInfo.lineInfo, testCaseInfo.name, testCaseInfo.description );

            Counts assertions;
            assertions.failed = 1;
            SectionStats testCaseSectionStats( testCaseSection, assertions, 0, false );
            m_reporter->sectionEnded( testCaseSectionStats );

            TestCaseInfo testInfo = m_activeTestCase->getTestCaseInfo();

            Totals deltaTotals;
            deltaTotals.testCases.failed = 1;
            m_reporter->testCaseEnded( TestCaseStats(   testInfo,
                                                        deltaTotals,
                                                        "",
                                                        "",
                                                        false ) );
            m_totals.testCases.failed++;
            testGroupEnded( "", m_totals, 1, 1 );
            m_reporter->testRunEnded( TestRunStats( m_runInfo, m_totals, false ) );
        }